

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Truck.cpp
# Opt level: O3

void __thiscall Truck::Truck(Truck *this,string *plate)

{
  (this->plate)._M_dataplus._M_p = (pointer)&(this->plate).field_2;
  (this->plate)._M_string_length = 0;
  (this->plate).field_2._M_local_buf[0] = '\0';
  this->capacity = INFINITY;
  std::__cxx11::string::_M_assign((string *)&this->plate);
  return;
}

Assistant:

Truck::Truck(string plate) {
    this->capacity = INFINITY;
    this->plate = plate;
}